

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::SingleSampleLineRasterizer::rasterize
          (SingleSampleLineRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  int i_6;
  int iVar4;
  int iVar5;
  long lVar6;
  SingleSampleLineRasterizer *pSVar7;
  int iVar8;
  int iVar9;
  float res_12;
  float fVar10;
  float sqSum;
  float fVar11;
  Vector<float,_2> res_11;
  Vector<long,_2> res_8;
  Vector<float,_2> res_15;
  Vector<float,_2> vec;
  Vector<float,_2> vec_1;
  Vector<long,_2> pa;
  Vector<long,_2> pb;
  IVec2 minorDirection;
  Vector<float,_2> res_9;
  SubpixelLineSegment line;
  Vector<long,_2> widthOffset;
  Vector<long,_2> res_10;
  Vector<float,_2> res_14;
  Vector<float,_2> res_13;
  int local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138 [6];
  IVec2 local_120;
  undefined1 local_118 [8];
  long lStack_110;
  undefined8 local_108;
  long lStack_100;
  undefined1 local_f8 [16];
  Vec4 *local_e8;
  long lStack_e0;
  int local_d8;
  int local_d4;
  uint local_d0 [2];
  float local_c8 [4];
  undefined1 local_b8 [16];
  Vec4 *local_a8;
  long lStack_a0;
  float local_98 [4];
  long local_88 [3];
  int *local_70;
  float local_68 [5];
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_14c = 1;
  local_70 = numPacketsRasterized;
  if (1.0 < this->m_lineWidth) {
    fVar10 = floorf(this->m_lineWidth + 0.5);
    local_14c = (int)fVar10;
  }
  local_b8._0_8_ = 0;
  local_b8._8_8_ = 0;
  lVar6 = 4;
  do {
    local_c8[lVar6] = (this->m_v0).m_data[lVar6] - (float)(this->m_viewport).m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  lVar6 = 4;
  do {
    *(float *)((long)&local_a8 + lVar6 * 4) =
         (this->m_v0).m_data[lVar6] - (float)(this->m_viewport).m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  local_48 = (float)(~-(uint)((float)local_b8._0_4_ < 0.0) & local_b8._0_4_ |
                    (uint)-(float)local_b8._0_4_ & -(uint)((float)local_b8._0_4_ < 0.0));
  local_68[4] = -local_98[1];
  if (-local_98[1] <= local_98[1]) {
    local_68[4] = local_98[1];
  }
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  uStack_54 = 0x80000000;
  uStack_50 = 0x80000000;
  uStack_4c = 0x80000000;
  bVar3 = local_48 < local_68[4];
  bVar2 = !bVar3;
  local_d0[0] = (uint)bVar3;
  pSVar7 = (SingleSampleLineRasterizer *)((this->m_viewport).m_data + 1);
  if (bVar3) {
    pSVar7 = this;
  }
  local_d0[1] = (uint)bVar2;
  local_d4 = (this->m_viewport).m_data[(ulong)bVar2 + 2] + (this->m_viewport).m_data[bVar2];
  local_d8 = (pSVar7->m_viewport).m_data[0];
  local_f8 = ZEXT816(0);
  lVar6 = 0;
  do {
    *(long *)(local_f8 + lVar6 * 8) = (long)(int)local_d0[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_b8._0_8_ = 0;
  local_b8._8_8_ = 0;
  lVar6 = 0;
  do {
    *(long *)(local_b8 + lVar6 * 8) = -*(long *)(local_f8 + lVar6 * 8);
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  lVar6 = 0;
  do {
    *(long *)(local_98 + lVar6 * 2) =
         *(long *)(local_b8 + lVar6 * 8) * (long)(local_14c * 0x100 + -0x100 >> 1);
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_e8 = &this->m_v0;
  lStack_e0 = 0x100000000;
  local_118 = (undefined1  [8])0x0;
  lVar6 = 0;
  do {
    *(float *)(local_118 + lVar6 * 4) = (this->m_v0).m_data[*(int *)((long)&lStack_e0 + lVar6 * 4)];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_b8._0_8_ =
       (long)((float)local_118._0_4_ * 256.0 +
             (float)(~-(uint)((float)local_118._0_4_ < 0.0) & 0x3f000000 |
                    -(uint)((float)local_118._0_4_ < 0.0) & 0xbf000000));
  local_b8._8_8_ =
       (long)((float)local_118._4_4_ * 256.0 +
             (float)(~-(uint)((float)local_118._4_4_ < 0.0) & 0x3f000000 |
                    -(uint)((float)local_118._4_4_ < 0.0) & 0xbf000000));
  local_f8 = ZEXT416(0);
  lVar6 = 0;
  do {
    *(long *)(local_f8 + lVar6 * 8) =
         *(long *)(local_98 + lVar6 * 2) + *(long *)(local_b8 + lVar6 * 8);
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  lStack_110 = 0x100000000;
  local_108 = 0;
  lVar6 = 0;
  do {
    *(float *)((long)&local_108 + lVar6 * 4) =
         (this->m_v1).m_data[*(int *)((long)&lStack_110 + lVar6 * 4)];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_b8._0_8_ =
       (long)((float)local_108 * 256.0 +
             (float)(~-(uint)((float)local_108 < 0.0) & 0x3f000000 |
                    -(uint)((float)local_108 < 0.0) & 0xbf000000));
  local_b8._8_8_ =
       (long)(local_108._4_4_ * 256.0 +
             (float)(~-(uint)(local_108._4_4_ < 0.0) & 0x3f000000 |
                    -(uint)(local_108._4_4_ < 0.0) & 0xbf000000));
  local_e8 = (Vec4 *)0x0;
  lStack_e0 = 0;
  lVar6 = 0;
  do {
    (&local_e8)[lVar6] = (Vec4 *)(*(long *)(local_98 + lVar6 * 2) + *(long *)(local_b8 + lVar6 * 8))
    ;
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_b8._0_8_ = local_f8._0_8_;
  local_b8._8_8_ = local_f8._8_8_;
  local_a8 = local_e8;
  lStack_a0 = lStack_e0;
  iVar8 = 0;
  do {
    iVar5 = (this->m_curPos).m_data[1];
    if (((this->m_bboxMax).m_data[1] < iVar5) || (maxFragmentPackets <= iVar8)) {
      *local_70 = iVar8;
      return;
    }
    local_108 = (long)((this->m_curPos).m_data[0] << 8);
    lStack_100 = (long)(iVar5 << 8);
    local_138[0] = 1.79366e-43;
    local_138[1] = 0.0;
    local_138[2] = 1.79366e-43;
    local_138[3] = 0.0;
    local_118 = (undefined1  [8])0x0;
    lStack_110 = 0;
    lVar6 = 0;
    do {
      *(long *)(local_118 + lVar6 * 8) = *(long *)(local_138 + lVar6 * 2) + (&local_108)[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    bVar3 = LineRasterUtil::doesLineSegmentExitDiamond
                      ((SubpixelLineSegment *)local_b8,(Vector<long,_2> *)local_118);
    if (bVar3) {
      local_108 = (long)local_118;
      lStack_100 = lStack_110;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      local_138[3] = 0.0;
      lVar6 = 0;
      do {
        *(long *)(local_138 + lVar6 * 2) = (&local_108)[lVar6] - *(long *)(local_f8 + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      lVar6 = 0;
      do {
        local_c8[lVar6] = (float)*(long *)(local_138 + lVar6 * 2);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_88[0] = 0;
      local_88[1] = 0;
      lVar6 = 0;
      do {
        local_88[lVar6] = (long)(&local_e8)[lVar6] - *(long *)(local_f8 + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_148 = 0;
      lVar6 = 0;
      do {
        *(float *)((long)&local_148 + lVar6 * 4) = (float)local_88[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      fVar10 = 0.0;
      lVar6 = 0;
      do {
        fVar10 = fVar10 + local_c8[lVar6] * *(float *)((long)&local_148 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      lVar6 = 0;
      do {
        local_68[lVar6 + 2] = (float)(long)(&local_e8)[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      lVar6 = 0;
      do {
        local_68[lVar6] = (float)*(long *)(local_f8 + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_120.m_data[0] = 0;
      local_120.m_data[1] = 0;
      lVar6 = 0;
      do {
        local_120.m_data[lVar6] = (int)(local_68[lVar6 + 2] - local_68[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      fVar11 = 0.0;
      lVar6 = 0;
      do {
        fVar11 = fVar11 + (float)local_120.m_data[lVar6] * (float)local_120.m_data[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      iVar5 = (this->m_curPos).m_data[local_68[4] <= local_48];
      iVar4 = local_d8 - iVar5;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      iVar5 = local_d4 - iVar5;
      if (local_14c <= iVar5) {
        iVar5 = local_14c;
      }
      iVar9 = this->m_curRowFragment + iVar4;
      bVar3 = iVar9 < iVar5;
      if (iVar9 < iVar5) {
        fVar10 = fVar10 / fVar11;
        do {
          local_138[0] = 0.0;
          local_138[1] = 0.0;
          lVar6 = 0;
          do {
            local_138[lVar6] = (float)(local_d0[lVar6] * iVar9);
            lVar6 = lVar6 + 1;
          } while (lVar6 == 1);
          local_120.m_data[0] = 0;
          local_120.m_data[1] = 0;
          lVar6 = 0;
          do {
            local_120.m_data[lVar6] = (int)local_138[lVar6] + (this->m_curPos).m_data[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 == 1);
          if (depthValues != (float *)0x0) {
            depthValues[iVar8 * 4] =
                 (this->m_v0).m_data[2] * (1.0 - fVar10) + (this->m_v1).m_data[2] * fVar10;
            depthValues[iVar8 * 4 + 1] = 0.0;
            depthValues[iVar8 * 4 + 2] = 0.0;
            depthValues[iVar8 * 4 + 3] = 0.0;
          }
          lVar6 = 0;
          do {
            local_138[lVar6] = 1.0 - fVar10;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          lVar6 = 0;
          do {
            *(float *)((long)local_88 + lVar6 * 4) = fVar10;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          local_148 = 0;
          uStack_140 = 0;
          lVar6 = 0;
          do {
            *(float *)((long)&local_148 + lVar6 * 4) =
                 local_138[lVar6] + *(float *)((long)local_88 + lVar6 * 4);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          local_c8[0] = 0.0;
          local_c8[1] = 0.0;
          local_c8[2] = 0.0;
          local_c8[3] = 0.0;
          lVar6 = 0;
          do {
            local_c8[lVar6] = 1.0 / *(float *)((long)&local_148 + lVar6 * 4);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          *&fragmentPackets[iVar8].position.m_data = local_120.m_data;
          fragmentPackets[iVar8].coverage = 1;
          local_148 = 0;
          uStack_140 = 0;
          lVar6 = 0;
          do {
            *(float *)((long)&local_148 + lVar6 * 4) = local_138[lVar6] * local_c8[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          *(undefined8 *)fragmentPackets[iVar8].barycentric[0].m_data = local_148;
          *(undefined8 *)(fragmentPackets[iVar8].barycentric[0].m_data + 2) = uStack_140;
          local_148 = 0;
          uStack_140 = 0;
          lVar6 = 0;
          do {
            *(float *)((long)&local_148 + lVar6 * 4) =
                 *(float *)((long)local_88 + lVar6 * 4) * local_c8[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          *(undefined8 *)fragmentPackets[iVar8].barycentric[1].m_data = local_148;
          *(undefined8 *)(fragmentPackets[iVar8].barycentric[1].m_data + 2) = uStack_140;
          fragmentPackets[iVar8].barycentric[2].m_data[0] = 0.0;
          fragmentPackets[iVar8].barycentric[2].m_data[1] = 0.0;
          fragmentPackets[iVar8].barycentric[2].m_data[2] = 0.0;
          fragmentPackets[iVar8].barycentric[2].m_data[3] = 0.0;
          iVar8 = iVar8 + 1;
          if (iVar8 == maxFragmentPackets) {
            this->m_curRowFragment = this->m_curRowFragment + 1;
            *local_70 = maxFragmentPackets;
            iVar8 = maxFragmentPackets;
            goto LAB_00539c45;
          }
          iVar9 = this->m_curRowFragment;
          this->m_curRowFragment = iVar9 + 1;
          iVar9 = iVar9 + iVar4 + 1;
          bVar3 = iVar9 < iVar5;
        } while (iVar9 < iVar5);
      }
      this->m_curRowFragment = 0;
LAB_00539c45:
      if (!bVar3) goto LAB_00539c4e;
      bVar3 = false;
    }
    else {
LAB_00539c4e:
      iVar5 = (this->m_curPos).m_data[0] + 1;
      (this->m_curPos).m_data[0] = iVar5;
      bVar3 = true;
      if ((this->m_bboxMax).m_data[0] < iVar5) {
        piVar1 = (this->m_curPos).m_data + 1;
        *piVar1 = *piVar1 + 1;
        (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
      }
    }
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void SingleSampleLineRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64								halfPixel			= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	const deInt32								lineWidth			= (m_lineWidth > 1.0f) ? deFloorFloatToInt32(m_lineWidth + 0.5f) : 1;
	const bool									isXMajor			= de::abs((m_v1 - m_v0).x()) >= de::abs((m_v1 - m_v0).y());
	const tcu::IVec2							minorDirection		= (isXMajor) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));
	const int									minViewportLimit	= (isXMajor) ? (m_viewport.y()) : (m_viewport.x());
	const int									maxViewportLimit	= (isXMajor) ? (m_viewport.y() + m_viewport.w()) : (m_viewport.x() + m_viewport.z());
	const tcu::Vector<deInt64,2>				widthOffset			= -minorDirection.cast<deInt64>() * (toSubpixelCoord(lineWidth - 1) / 2);
	const tcu::Vector<deInt64,2>				pa					= LineRasterUtil::toSubpixelVector(m_v0.xy()) + widthOffset;
	const tcu::Vector<deInt64,2>				pb					= LineRasterUtil::toSubpixelVector(m_v1.xy()) + widthOffset;
	const LineRasterUtil::SubpixelLineSegment	line				= LineRasterUtil::SubpixelLineSegment(pa, pb);

	int											packetNdx			= 0;

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const tcu::Vector<deInt64,2> diamondPosition = LineRasterUtil::toSubpixelVector(m_curPos) + tcu::Vector<deInt64,2>(halfPixel,halfPixel);

		// Should current fragment be drawn? == does the segment exit this diamond?
		if (LineRasterUtil::doesLineSegmentExitDiamond(line, diamondPosition))
		{
			const tcu::Vector<deInt64,2>	pr					= diamondPosition;
			const float						t					= tcu::dot((pr - pa).asFloat(), (pb - pa).asFloat()) / tcu::lengthSquared(pb.asFloat() - pa.asFloat());

			// Rasterize on only fragments that are would end up in the viewport (i.e. visible)
			const int						fragmentLocation	= (isXMajor) ? (m_curPos.y()) : (m_curPos.x());
			const int						rowFragBegin		= de::max(0, minViewportLimit - fragmentLocation);
			const int						rowFragEnd			= de::min(maxViewportLimit - fragmentLocation, lineWidth);

			// Wide lines require multiple fragments.
			for (; rowFragBegin + m_curRowFragment < rowFragEnd; m_curRowFragment++)
			{
				const int			replicationId	= rowFragBegin + m_curRowFragment;
				const tcu::IVec2	fragmentPos		= m_curPos + minorDirection * replicationId;

				// We only rasterize visible area
				DE_ASSERT(LineRasterUtil::inViewport(fragmentPos, m_viewport));

				// Compute depth values.
				if (depthValues)
				{
					const float za = m_v0.z();
					const float zb = m_v1.z();

					depthValues[packetNdx*4+0] = (1 - t) * za + t * zb;
					depthValues[packetNdx*4+1] = 0;
					depthValues[packetNdx*4+2] = 0;
					depthValues[packetNdx*4+3] = 0;
				}

				{
					// output this fragment
					// \note In order to make consistent output with multisampled line rasterization, output "barycentric" coordinates
					FragmentPacket& packet = fragmentPackets[packetNdx];

					const tcu::Vec4		b0		= tcu::Vec4(1 - t);
					const tcu::Vec4		b1		= tcu::Vec4(t);
					const tcu::Vec4		ooSum	= 1.0f / (b0 + b1);

					packet.position			= fragmentPos;
					packet.coverage			= getCoverageBit(1, 0, 0, 0);
					packet.barycentric[0]	= b0 * ooSum;
					packet.barycentric[1]	= b1 * ooSum;
					packet.barycentric[2]	= tcu::Vec4(0.0f);

					packetNdx += 1;
				}

				if (packetNdx == maxFragmentPackets)
				{
					m_curRowFragment++; // don't redraw this fragment again next time
					numPacketsRasterized = packetNdx;
					return;
				}
			}

			m_curRowFragment = 0;
		}

		++m_curPos.x();
		if (m_curPos.x() > m_bboxMax.x())
		{
			++m_curPos.y();
			m_curPos.x() = m_bboxMin.x();
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}